

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void minLiterals(void)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint n;
  int l;
  size_t sVar8;
  
  if (isSat == 0) {
    groupSize = 4;
    groups = (numOfVariables + 2) / 4;
    if (numOfVariables == 1) {
      groups = 1;
    }
    n = groups * 4 + 1;
    sVar8 = (long)(groups * 4 + 2) << 2;
    numOfVariables = n;
    permute = (int *)malloc(sVar8);
    unpermute = (int *)malloc(sVar8);
    piVar4 = (int *)malloc(sVar8);
    uVar6 = 0;
    if (0 < (int)n) {
      uVar6 = (ulong)n;
    }
    idpermute = piVar4;
    for (lVar5 = 1; lVar5 - uVar6 != 1; lVar5 = lVar5 + 1) {
      piVar4[lVar5] = (int)lVar5;
    }
    heading(n);
    initGlobalPermute();
    setPlainPermute();
    for (iVar7 = 0; iVar7 < groups + -1; iVar7 = iVar7 + 1) {
      mainUnsatGroup(iVar7,-1);
    }
    lastUnsatGroup(-1);
    setAnnealingPermute();
    for (iVar7 = 0; iVar7 < groups + -1; iVar7 = iVar7 + 1) {
      mainUnsatGroup(iVar7,1);
    }
    lastUnsatGroup(1);
    return;
  }
  groupSize = 5;
  numOfVariables = ((numOfVariables + -1) - (numOfVariables + -1) % 5) + 5;
  groups = numOfVariables / 5;
  initModel(numOfVariables);
  iVar7 = numOfVariables;
  sVar8 = (long)numOfVariables * 4 + 4;
  idpermute = (int *)malloc(sVar8);
  permute = (int *)malloc(sVar8);
  unpermute = (int *)malloc(sVar8);
  permute1 = (int *)malloc(sVar8);
  unpermute1 = (int *)malloc(sVar8);
  heading(iVar7);
  piVar4 = idpermute;
  for (lVar5 = 1; lVar5 <= numOfVariables; lVar5 = lVar5 + 1) {
    piVar4[lVar5] = (int)lVar5;
  }
  initGlobalPermute();
  setPlainPermute();
  for (iVar7 = 0; iVar7 < groups; iVar7 = iVar7 + 1) {
    firstSatGroup(iVar7,-1);
  }
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    l = iVar7;
    setAnnealingPermute1(iVar7);
    secondSatGroup(l,1);
    piVar3 = unpermute1;
    piVar2 = unpermute;
    piVar1 = permute;
    piVar4 = permute1;
    lVar5 = 1;
    if (iVar7 == 0) {
      for (; lVar5 <= numOfVariables; lVar5 = lVar5 + 1) {
        piVar4[lVar5] = piVar1[lVar5];
        piVar3[lVar5] = piVar2[lVar5];
      }
      initChums();
    }
  }
  if (*stringOptions == (char *)0x0) {
    return;
  }
  printModel(*stringOptions);
  return;
}

Assistant:

void minLiterals ()
{
    int g,l,v;

    if (isSat)
    {
        groupSize = 5;
        numOfVariables = ((numOfVariables-1)/groupSize + 1) * groupSize;
        groups = numOfVariables/groupSize;
        initModel(numOfVariables);
        idpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        permute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        unpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
         permute1 = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
         unpermute1 = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        heading(numOfVariables);
       for (v=1;v<=numOfVariables;v++)
           idpermute[v] = v;

        initGlobalPermute();
        setPlainPermute();
        for (g=0;g<groups;g++)
            firstSatGroup (g, -1);


        for (l=0;l<2;l++)
        {
            setAnnealingPermute1(l);
            secondSatGroup(l, 1);
            if (l==0)
            {
                for (v=1;v<=numOfVariables;v++)
                {
                    permute1[v] = permute[v];
                    unpermute1[v] = unpermute[v];
                }
				initChums();
            }
        }
        if (stringOptions[MODEL] != NULL)
            printModel (stringOptions[MODEL]);
    }
    else
    {
        groupSize = 4;
        if (numOfVariables == 1)
            numOfVariables = 2;
        groups = (numOfVariables+2)/groupSize;
        numOfVariables = groupSize*groups + 1;
        permute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        unpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        idpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        for (v=1;v<=numOfVariables;v++)
        {
            idpermute[v] = v;
        }
        heading(numOfVariables);


        initGlobalPermute();
        setPlainPermute();
        for (g=0;g<groups-1;g++)
            mainUnsatGroup (g,-1);
        lastUnsatGroup (-1);
        setAnnealingPermute();
        for (g=0;g<groups-1;g++)
            mainUnsatGroup (g,1);
        lastUnsatGroup (1);
    }
}